

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

obj * o_in(obj *obj,char oclass)

{
  obj *poVar1;
  obj *temp;
  obj *otmp;
  char oclass_local;
  obj *obj_local;
  
  obj_local = obj;
  if (obj->oclass != oclass) {
    if (obj->cobj != (obj *)0x0) {
      for (temp = obj->cobj; temp != (obj *)0x0; temp = temp->nobj) {
        if (temp->oclass == oclass) {
          return temp;
        }
        if ((temp->cobj != (obj *)0x0) && (poVar1 = o_in(temp,oclass), poVar1 != (obj *)0x0)) {
          return poVar1;
        }
      }
    }
    obj_local = (obj *)0x0;
  }
  return obj_local;
}

Assistant:

static struct obj *o_in(struct obj *obj, char oclass)
{
    struct obj *otmp;
    struct obj *temp;

    if (obj->oclass == oclass) return obj;

    if (Has_contents(obj)) {
	for (otmp = obj->cobj; otmp; otmp = otmp->nobj)
	    if (otmp->oclass == oclass) return otmp;
	    else if (Has_contents(otmp) && (temp = o_in(otmp, oclass)))
		return temp;
    }
    return NULL;
}